

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_client.cpp
# Opt level: O3

bool tcp_send(char *command,uint8_t command_length)

{
  ulong __n;
  uint16_t uVar1;
  uint8_t *data;
  ulong uVar2;
  ssize_t sVar3;
  undefined7 in_register_00000031;
  bool bVar4;
  uint8_t response [5];
  short local_2d;
  char local_2b;
  uint16_t local_2a;
  
  uVar2 = CONCAT71(in_register_00000031,command_length) & 0xffffffff;
  __n = uVar2 + 2;
  data = (uint8_t *)operator_new__(__n);
  strncpy((char *)data,command,uVar2);
  uVar1 = crc16(data,command_length);
  *(uint16_t *)(data + uVar2) = uVar1;
  bVar4 = false;
  uVar2 = send(tcp_socket,data,__n,0);
  operator_delete(data);
  if (uVar2 == __n) {
    bVar4 = false;
    sVar3 = recv(tcp_socket,&local_2d,5,0);
    if (sVar3 == 5) {
      uVar1 = crc16((uint8_t *)&local_2d,'\x03');
      if (local_2a == uVar1) {
        bVar4 = local_2b == 'p' && local_2d == 0x7579;
      }
      else {
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool tcp_send(const char *command, uint8_t command_length)
{
    uint8_t *data = new uint8_t[command_length + 2];
    strncpy((char*)data, command, command_length);

    uint16_t crc = crc16(data, command_length);

    data[command_length] = crc & 0xFF;
    data[command_length + 1] = crc >> 8;

    if (send(tcp_socket, data, command_length + 2, 0) != command_length + 2)
    {
        delete data;
        return false;
    }

    delete data;

    uint8_t response[5];

    if (recv(tcp_socket, response, 5, 0) != 5)
        return false;

    crc = response[4] << 8;
    crc |= response[3];

    if (crc != crc16(response, 3))
        return false;

    if (strncmp("yup", (char*)response, 3) != 0)
        return false;

    return true;
}